

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.cpp
# Opt level: O0

mz_bool duckdb_miniz::mz_zip_reader_init(mz_zip_archive *pZip,mz_uint64 size,mz_uint flags)

{
  mz_bool mVar1;
  mz_uint in_EDX;
  mz_zip_archive *in_RSI;
  mz_zip_archive *in_RDI;
  mz_uint in_stack_00001104;
  mz_zip_archive *in_stack_00001108;
  mz_bool local_10;
  
  if ((in_RDI == (mz_zip_archive *)0x0) || (in_RDI->m_pRead == (mz_file_read_func)0x0)) {
    if (in_RDI != (mz_zip_archive *)0x0) {
      in_RDI->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    }
    local_10 = 0;
  }
  else {
    mVar1 = mz_zip_reader_init_internal(in_RSI,in_EDX);
    if (mVar1 == 0) {
      local_10 = 0;
    }
    else {
      in_RDI->m_zip_type = MZ_ZIP_TYPE_USER;
      in_RDI->m_archive_size = (mz_uint64)in_RSI;
      mVar1 = mz_zip_reader_read_central_dir(in_stack_00001108,in_stack_00001104);
      if (mVar1 == 0) {
        mz_zip_reader_end_internal(in_RDI,(mz_bool)((ulong)in_RSI >> 0x20));
        local_10 = 0;
      }
      else {
        local_10 = 1;
      }
    }
  }
  return local_10;
}

Assistant:

mz_bool mz_zip_reader_init(mz_zip_archive *pZip, mz_uint64 size, mz_uint flags)
{
    if ((!pZip) || (!pZip->m_pRead))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    if (!mz_zip_reader_init_internal(pZip, flags))
        return MZ_FALSE;

    pZip->m_zip_type = MZ_ZIP_TYPE_USER;
    pZip->m_archive_size = size;

    if (!mz_zip_reader_read_central_dir(pZip, flags))
    {
        mz_zip_reader_end_internal(pZip, MZ_FALSE);
        return MZ_FALSE;
    }

    return MZ_TRUE;
}